

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<MPL::ModelPackage>::init_holder(PyObject *inst_,void *holder_ptr)

{
  byte bVar1;
  instance_type *inst;
  
  if (holder_ptr == (void *)0x0) {
    bVar1 = (byte)inst_[2].ob_refcnt;
    if ((bVar1 & 1) == 0) {
      return;
    }
    inst_[2].ob_type = (PyTypeObject *)inst_[1].ob_refcnt;
  }
  else {
    inst_[2].ob_type = *holder_ptr;
    *(undefined8 *)holder_ptr = 0;
    bVar1 = (byte)inst_[2].ob_refcnt;
  }
  *(byte *)&inst_[2].ob_refcnt = bVar1 | 2;
  return;
}

Assistant:

static void init_holder_helper(instance_type *inst, const holder_type *holder_ptr, const void * /* dummy */) {
        if (holder_ptr) {
            init_holder_from_existing(inst, holder_ptr, std::is_copy_constructible<holder_type>());
            inst->holder_constructed = true;
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (&inst->holder) holder_type(inst->value);
            inst->holder_constructed = true;
        }
    }